

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPObservation::operator()
          (StoreLPObservation *this,iterator_t *str,iterator_t *end)

{
  parsed_t pVar1;
  ParserPOMDPFormat_Spirit *pPVar2;
  iterator iVar3;
  E *this_00;
  uint uVar4;
  uint *__args;
  E e;
  Index aI;
  Index local_1b0 [98];
  
  pPVar2 = this->_m_po;
  pVar1 = pPVar2->_m_lp_type;
  if (pVar1 == ASTERICK) {
    iVar3._M_current =
         (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &pPVar2->_m_anyJOIndex;
      goto LAB_00454324;
    }
    uVar4 = pPVar2->_m_anyJOIndex;
  }
  else {
    if (pVar1 == STRING) {
      local_1b0[0] = MADPComponentDiscreteObservations::GetObservationIndexByName
                               (&(pPVar2->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete._m_O,&pPVar2->_m_lp_string,
                                (Index)((ulong)((long)(pPVar2->_m_lp_JO).
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(pPVar2->_m_lp_JO).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
      pPVar2 = this->_m_po;
      iVar3._M_current =
           (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current !=
          (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        *iVar3._M_current = local_1b0[0];
        (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        return;
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar2->_m_lp_JO,iVar3,
                 local_1b0);
      return;
    }
    if (pVar1 != UINT) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "StoreLPObservation expected that the last parsed type is a action index(uint), action name (string) or wilcard (\'*\')."
          );
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    iVar3._M_current =
         (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &pPVar2->_m_lp_uint;
LAB_00454324:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar2->_m_lp_JO,iVar3,__args
                );
      return;
    }
    uVar4 = pPVar2->_m_lp_uint;
  }
  *iVar3._M_current = uVar4;
  (pPVar2->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {

                if(DEBUG_POMDP_PARSE)
                    std::cout << "StoreLPObservation: pushing "<<std::string(str,end)<< 
                        " on _m_lp_JO"<<std::endl;
                if(_m_po->_m_lp_type == UINT)
                    _m_po->_m_lp_JO.push_back(_m_po->_m_lp_uint);
                else if(_m_po->_m_lp_type == STRING)
                {
                    //make sure that _m_lp_JO is cleared after each joint action
                    //so we can do this:
                    Index curAgIndex =  _m_po->_m_lp_JO.size();
                    try
                    {
                        Index aI = _m_po->GetPOMDPDiscrete()->GetObservationIndexByName(
                            _m_po->_m_lp_string, curAgIndex);
                        _m_po->_m_lp_JO.push_back(aI);
                    }
                    catch(E e)
                    {
                        std::stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                            str.get_position() << ")"<<std::endl;
                        throw EParse(ermsg);
                    }
                }
                else if(_m_po->_m_lp_type == ASTERICK )
                    _m_po->_m_lp_JO.push_back(_m_po->_m_anyJOIndex);
                else
                    throw E("StoreLPObservation expected that the last parsed type is a action index(uint), action name (string) or wilcard ('*').");
            }